

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O1

TxSize wallet::CalculateMaximumSignedTxSize
                 (CTransaction *tx,CWallet *wallet,vector<CTxOut,_std::allocator<CTxOut>_> *txouts,
                 CCoinControl *coin_control)

{
  CTxOut *pCVar1;
  CCoinControl *this;
  CWallet *wallet_00;
  Descriptor *desc_00;
  bool bVar2;
  bool bVar3;
  int iVar4;
  CTxOut *txo;
  _Storage<long,_true> _Var5;
  ulong uVar6;
  int64_t iVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  _Storage<long,_true> outpoint;
  __normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_> __it;
  ulong nWeight;
  __normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_> _Var11;
  int iVar12;
  long lVar13;
  pointer pCVar14;
  long in_FS_OFFSET;
  optional<long> oVar15;
  TxSize TVar16;
  unique_ptr<Descriptor,_std::default_delete<Descriptor>_> desc;
  CCoinControl *local_e0;
  CWallet *local_d8;
  Descriptor *local_d0;
  _Storage<CTxIn,_false> local_c8;
  char local_60;
  direct_or_indirect local_58;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar8 = ((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
  iVar4 = 9;
  if ((0xfc < uVar8) && (iVar4 = 0xb, 0xffff < uVar8)) {
    iVar4 = (uint)(uVar8 >> 0x20 != 0) * 4 + 0xd;
  }
  uVar8 = ((long)(tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
  iVar12 = 1;
  if ((0xfc < uVar8) && (iVar12 = 3, 0xffff < uVar8)) {
    iVar12 = (uint)(uVar8 >> 0x20 != 0) * 4 + 5;
  }
  uVar8 = (ulong)(uint)((iVar12 + iVar4) * 4);
  __it._M_current =
       (txouts->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.super__Vector_impl_data
       ._M_start;
  pCVar1 = (txouts->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_c8._0_8_ = &local_d8;
  local_c8._8_8_ = &local_e0;
  lVar13 = ((long)pCVar1 - (long)__it._M_current >> 3) * -0x3333333333333333 >> 2;
  local_e0 = coin_control;
  local_d8 = wallet;
  if (0 < lVar13) {
    lVar13 = lVar13 + 1;
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::$_0>
              ::operator()((_Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::__0>
                            *)&local_c8._M_value,__it);
      _Var11._M_current = __it._M_current;
      if (bVar2) goto LAB_00513b57;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::$_0>
              ::operator()((_Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::__0>
                            *)&local_c8._M_value,__it._M_current + 1);
      _Var11._M_current = __it._M_current + 1;
      if (bVar2) goto LAB_00513b57;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::$_0>
              ::operator()((_Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::__0>
                            *)&local_c8._M_value,__it._M_current + 2);
      _Var11._M_current = __it._M_current + 2;
      if (bVar2) goto LAB_00513b57;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::$_0>
              ::operator()((_Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::__0>
                            *)&local_c8._M_value,__it._M_current + 3);
      _Var11._M_current = __it._M_current + 3;
      if (bVar2) goto LAB_00513b57;
      __it._M_current = __it._M_current + 4;
      lVar13 = lVar13 + -1;
    } while (1 < lVar13);
  }
  lVar13 = ((long)pCVar1 - (long)__it._M_current >> 3) * -0x3333333333333333;
  if (lVar13 != 1) {
    if (lVar13 != 2) {
      _Var11._M_current = pCVar1;
      if ((lVar13 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::$_0>
                  ::operator()((_Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::__0>
                                *)&local_c8._M_value,__it), _Var11._M_current = __it._M_current,
         bVar2)) goto LAB_00513b57;
      __it._M_current = __it._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::$_0>
            ::operator()((_Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::__0>
                          *)&local_c8._M_value,__it);
    _Var11._M_current = __it._M_current;
    if (bVar2) goto LAB_00513b57;
    __it._M_current = __it._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::$_0>
          ::operator()((_Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::__0>
                        *)&local_c8._M_value,__it);
  _Var11._M_current = __it._M_current;
  if (!bVar2) {
    _Var11._M_current = pCVar1;
  }
LAB_00513b57:
  nWeight = uVar8 | 2;
  if (_Var11._M_current == pCVar1) {
    nWeight = uVar8;
  }
  for (pCVar14 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pCVar14 !=
      (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
      ._M_finish; pCVar14 = pCVar14 + 1) {
    uVar10 = (pCVar14->scriptPubKey).super_CScriptBase._size;
    uVar9 = uVar10 - 0x1d;
    if (uVar10 < 0x1d) {
      uVar9 = uVar10;
    }
    lVar13 = (ulong)(0xffff < uVar9) * 2 + 3;
    if (uVar9 < 0xfd) {
      lVar13 = 1;
    }
    nWeight = nWeight + ((ulong)uVar9 + lVar13) * 4 + 0x20;
  }
  pCVar14 = (txouts->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
            super__Vector_impl_data._M_start;
  bVar2 = (txouts->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
          super__Vector_impl_data._M_finish != pCVar14;
  if (bVar2) {
    uVar10 = 1;
    uVar8 = 0;
    do {
      wallet_00 = local_d8;
      this = local_e0;
      outpoint._M_value =
           (long)((tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_start + uVar8);
      bVar3 = CWallet::CanGrindR(local_d8);
      if (this == (CCoinControl *)0x0) {
LAB_00513c21:
        prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_58.indirect_contents,
                   &pCVar14[uVar8].scriptPubKey.super_CScriptBase);
        GetDescriptor((wallet *)&local_d0,wallet_00,this,(CScript *)&local_58.indirect_contents);
        if (0x1c < local_3c) {
          free(local_58.indirect_contents.indirect);
          local_58.indirect_contents.indirect = (char *)0x0;
        }
        desc_00 = local_d0;
        if (local_d0 == (Descriptor *)0x0) {
          uVar9 = 0;
          _Var5._M_value = outpoint._M_value;
        }
        else {
          std::_Optional_payload_base<CTxIn>::_Storage<CTxIn,false>::_Storage<CTxIn_const&>
                    ((_Storage<CTxIn,false> *)&local_c8,outpoint._M_value);
          local_60 = '\x01';
          oVar15 = MaxInputWeight(desc_00,(optional<CTxIn> *)&local_c8._M_value,this,
                                  _Var11._M_current != pCVar1,bVar3);
          uVar9 = oVar15.super__Optional_base<long,_true,_true>._M_payload.
                  super__Optional_payload_base<long>._8_4_;
          _Var5._M_value =
               oVar15.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._M_payload;
          if (local_60 == '\x01') {
            std::_Optional_payload_base<CTxIn>::_M_destroy
                      ((_Optional_payload_base<CTxIn> *)&local_c8._M_value);
          }
        }
        if (local_d0 != (Descriptor *)0x0) {
          (*local_d0->_vptr_Descriptor[1])();
        }
      }
      else {
        oVar15 = CCoinControl::GetInputWeight(this,(COutPoint *)outpoint);
        _Var5._M_value =
             oVar15.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload;
        if (((undefined1  [16])
             oVar15.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long> & (undefined1  [16])0x1) == (undefined1  [16])0x0)
        goto LAB_00513c21;
        uVar9 = 1;
      }
      if ((uVar9 & 1) != 0) {
        if (_Var5._M_value < 0) {
          __assert_fail("*txin_weight > -1",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/spend.cpp"
                        ,0x9e,
                        "TxSize wallet::CalculateMaximumSignedTxSize(const CTransaction &, const CWallet *, const std::vector<CTxOut> &, const CCoinControl *)"
                       );
        }
        nWeight = nWeight + _Var5._M_value;
      }
      if ((uVar9 & 1) == 0) break;
      uVar8 = (ulong)uVar10;
      pCVar14 = (txouts->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar6 = ((long)(txouts->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar14 >> 3) * -0x3333333333333333;
      uVar10 = uVar10 + 1;
      bVar3 = uVar6 - uVar8 != 0;
      bVar2 = uVar8 <= uVar6 && bVar3;
    } while (uVar8 <= uVar6 && bVar3);
  }
  iVar7 = -1;
  uVar8 = 0xffffffffffffffff;
  if (!bVar2) {
    iVar7 = GetVirtualTransactionSize(nWeight,0,0);
    uVar8 = nWeight;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    TVar16.weight = uVar8;
    TVar16.vsize = iVar7;
    return TVar16;
  }
  __stack_chk_fail();
}

Assistant:

TxSize CalculateMaximumSignedTxSize(const CTransaction &tx, const CWallet *wallet, const std::vector<CTxOut>& txouts, const CCoinControl* coin_control)
{
    // version + nLockTime + input count + output count
    int64_t weight = (4 + 4 + GetSizeOfCompactSize(tx.vin.size()) + GetSizeOfCompactSize(tx.vout.size())) * WITNESS_SCALE_FACTOR;
    // Whether any input spends a witness program. Necessary to run before the next loop over the
    // inputs in order to accurately compute the compactSize length for the witness data per input.
    bool is_segwit = std::any_of(txouts.begin(), txouts.end(), [&](const CTxOut& txo) {
        std::unique_ptr<Descriptor> desc{GetDescriptor(wallet, coin_control, txo.scriptPubKey)};
        if (desc) return IsSegwit(*desc);
        return false;
    });
    // Segwit marker and flag
    if (is_segwit) weight += 2;

    // Add the size of the transaction outputs.
    for (const auto& txo : tx.vout) weight += GetSerializeSize(txo) * WITNESS_SCALE_FACTOR;

    // Add the size of the transaction inputs as if they were signed.
    for (uint32_t i = 0; i < txouts.size(); i++) {
        const auto txin_weight = GetSignedTxinWeight(wallet, coin_control, tx.vin[i], txouts[i], is_segwit, wallet->CanGrindR());
        if (!txin_weight) return TxSize{-1, -1};
        assert(*txin_weight > -1);
        weight += *txin_weight;
    }

    // It's ok to use 0 as the number of sigops since we never create any pathological transaction.
    return TxSize{GetVirtualTransactionSize(weight, 0, 0), weight};
}